

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O0

bool cmCTestScriptHandler::TryToRemoveBinaryDirectoryOnce(string *directoryPath)

{
  undefined8 uVar1;
  bool bVar2;
  unsigned_long uVar3;
  char *__s;
  byte local_13d;
  Status local_104;
  Status local_fc;
  Status local_f4;
  byte local_e9;
  undefined1 local_e8 [7];
  bool isDirectory;
  cmAlphaNum local_b8;
  undefined1 local_88 [8];
  string fullPath;
  undefined1 local_60 [8];
  string path;
  unsigned_long i;
  Directory local_20;
  Directory directory;
  string *directoryPath_local;
  
  directory.Internal = (DirectoryInternals *)directoryPath;
  cmsys::Directory::Directory(&local_20);
  cmsys::Directory::Load(&local_20,(string *)directory.Internal,(string *)0x0);
  for (path.field_2._8_8_ = 0; uVar1 = path.field_2._8_8_,
      uVar3 = cmsys::Directory::GetNumberOfFiles(&local_20), (ulong)uVar1 < uVar3;
      path.field_2._8_8_ = path.field_2._8_8_ + 1) {
    __s = cmsys::Directory::GetFile(&local_20,path.field_2._8_8_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_60,__s,(allocator<char> *)(fullPath.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(fullPath.field_2._M_local_buf + 0xf));
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_60,".");
    if (((bVar2) ||
        (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_60,".."), bVar2)) ||
       (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_60,"CMakeCache.txt"), bVar2)) {
      fullPath.field_2._8_4_ = 4;
    }
    else {
      cmAlphaNum::cmAlphaNum(&local_b8,(string *)directory.Internal);
      cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_e8,"/");
      cmStrCat<std::__cxx11::string>
                ((string *)local_88,&local_b8,(cmAlphaNum *)local_e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
      bVar2 = cmsys::SystemTools::FileIsDirectory((string *)local_88);
      local_13d = 0;
      if (bVar2) {
        bVar2 = cmsys::SystemTools::FileIsSymlink((string *)local_88);
        local_13d = bVar2 ^ 0xff;
      }
      local_e9 = local_13d & 1;
      if (local_e9 == 0) {
        local_fc = cmsys::SystemTools::RemoveFile((string *)local_88);
        bVar2 = cmsys::Status::operator_cast_to_bool(&local_fc);
        if (((bVar2 ^ 0xffU) & 1) == 0) goto LAB_0026d5fb;
        directoryPath_local._7_1_ = 0;
        fullPath.field_2._8_4_ = 1;
      }
      else {
        local_f4 = cmsys::SystemTools::RemoveADirectory((string *)local_88);
        bVar2 = cmsys::Status::operator_cast_to_bool(&local_f4);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
LAB_0026d5fb:
          fullPath.field_2._8_4_ = 0;
        }
        else {
          directoryPath_local._7_1_ = 0;
          fullPath.field_2._8_4_ = 1;
        }
      }
      std::__cxx11::string::~string((string *)local_88);
    }
    std::__cxx11::string::~string((string *)local_60);
    if ((fullPath.field_2._8_4_ != 0) && (fullPath.field_2._8_4_ != 4)) goto LAB_0026d694;
  }
  local_104 = cmsys::SystemTools::RemoveADirectory((string *)directory.Internal);
  directoryPath_local._7_1_ = cmsys::Status::operator_cast_to_bool(&local_104);
  fullPath.field_2._8_4_ = 1;
LAB_0026d694:
  cmsys::Directory::~Directory(&local_20);
  return (bool)(directoryPath_local._7_1_ & 1);
}

Assistant:

bool cmCTestScriptHandler::TryToRemoveBinaryDirectoryOnce(
  const std::string& directoryPath)
{
  cmsys::Directory directory;
  directory.Load(directoryPath);

  for (unsigned long i = 0; i < directory.GetNumberOfFiles(); ++i) {
    std::string path = directory.GetFile(i);

    if (path == "." || path == ".." || path == "CMakeCache.txt") {
      continue;
    }

    std::string fullPath = cmStrCat(directoryPath, "/", path);

    bool isDirectory = cmSystemTools::FileIsDirectory(fullPath) &&
      !cmSystemTools::FileIsSymlink(fullPath);

    if (isDirectory) {
      if (!cmSystemTools::RemoveADirectory(fullPath)) {
        return false;
      }
    } else {
      if (!cmSystemTools::RemoveFile(fullPath)) {
        return false;
      }
    }
  }

  return static_cast<bool>(cmSystemTools::RemoveADirectory(directoryPath));
}